

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QByteArray * QUtf8::convertFromUnicode(QStringView in,State *state)

{
  char *pcVar1;
  char *pcVar2;
  __off_t __length;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char *end;
  QByteArray *ba;
  State *in_stack_00000360;
  QStringView in_stack_00000368;
  QByteArray *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff88;
  Initialization IVar3;
  QByteArray *this;
  QStringView local_18;
  long local_8;
  
  IVar3 = (Initialization)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QStringView::size(&local_18);
  QByteArray::QByteArray(this,(qsizetype)in_RDI,IVar3);
  pcVar1 = QByteArray::data(in_stack_ffffffffffffff70);
  pcVar1 = convertFromUnicode(pcVar1,in_stack_00000368,in_stack_00000360);
  pcVar2 = QByteArray::data(in_stack_ffffffffffffff70);
  QByteArray::truncate(this,pcVar1 + -(long)pcVar2,__length);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QByteArray QUtf8::convertFromUnicode(QStringView in, QStringConverter::State *state)
{
    QByteArray ba(3*in.size() +3, Qt::Uninitialized);
    char *end = convertFromUnicode(ba.data(), in, state);
    ba.truncate(end - ba.data());
    return ba;
}